

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PathIntegrator::Li
          (PathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  Vector3f wi;
  Vector3f wi_00;
  undefined1 auVar8 [16];
  LightSampleContext ctx;
  LightSampleContext ctx_00;
  Vector3f wiRender;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f woRender;
  Vector3f woRender_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  bool bVar53;
  ShapeIntersection *pSVar54;
  ShapeIntersection *pSVar55;
  float *pfVar56;
  long lVar57;
  int iVar58;
  CameraTransform *in_RDX;
  long in_RSI;
  long in_RDI;
  void *in_R9;
  long *in_FS_OFFSET;
  Float FVar59;
  Float FVar60;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 auVar61 [16];
  SamplerHandle *sampler_00;
  RayDifferential *pRVar66;
  RayDifferential *pRVar67;
  undefined8 extraout_XMM0_Qb;
  Point2f *pPVar68;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  float fVar70;
  undefined1 in_ZMM1 [64];
  undefined1 auVar71 [56];
  Vector3<float> VVar72;
  SampledSpectrum SVar73;
  SampledSpectrum SVar74;
  Float q;
  SampledSpectrum rrBeta;
  BSDFSample bs;
  Float u;
  Vector3f wo;
  SampledSpectrum Ld;
  SampledSpectrum albedo;
  BSDFSample bs_1;
  Point2f u_1;
  Float uc;
  int i;
  SampledSpectrum rho;
  int nRhoSamples;
  BSDF bsdf;
  SurfaceInteraction *isect;
  Float weight_1;
  Float lightPDF_1;
  LightHandle areaLight;
  SampledSpectrum Le;
  Float weight;
  Float lightPDF;
  SampledSpectrum Le_1;
  LightHandle *light;
  const_iterator __end3;
  const_iterator __begin3;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range3;
  optional<pbrt::ShapeIntersection> si;
  SurfaceInteraction prevIntr;
  Float bsdfPDF;
  Float etaScale;
  int depth;
  bool anyNonSpecularBounces;
  bool specularBounce;
  SampledSpectrum beta;
  SampledSpectrum L;
  Interval<float> in_stack_fffffffffffff2c8;
  Interval<float> in_stack_fffffffffffff2d0;
  Interval<float> in_stack_fffffffffffff2d8;
  Ray *in_stack_fffffffffffff2e0;
  Integrator *in_stack_fffffffffffff2e8;
  SampledWavelengths *in_stack_fffffffffffff2f0;
  Vector3f *in_stack_fffffffffffff2f8;
  SurfaceInteraction *in_stack_fffffffffffff300;
  undefined8 in_stack_fffffffffffff308;
  int in_stack_fffffffffffff310;
  Float in_stack_fffffffffffff314;
  float in_stack_fffffffffffff32c;
  undefined8 in_stack_fffffffffffff330;
  undefined8 in_stack_fffffffffffff340;
  BxDFReflTransFlags in_stack_fffffffffffff348;
  TransportMode in_stack_fffffffffffff34c;
  undefined4 in_stack_fffffffffffff350;
  float in_stack_fffffffffffff354;
  undefined1 in_stack_fffffffffffff358;
  undefined1 in_stack_fffffffffffff359;
  undefined1 in_stack_fffffffffffff35a;
  undefined1 in_stack_fffffffffffff35b;
  Float in_stack_fffffffffffff35c;
  Float in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff364;
  undefined8 in_stack_fffffffffffff368;
  undefined4 uStack_c8c;
  Tuple3<pbrt::Vector3,_float> woRender_01;
  float in_stack_fffffffffffff398;
  float in_stack_fffffffffffff39c;
  Point2f *in_stack_fffffffffffff3a0;
  Float in_stack_fffffffffffff3ac;
  BSDF *in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b8;
  type in_stack_fffffffffffff3bc;
  undefined4 in_stack_fffffffffffff3c0;
  Float in_stack_fffffffffffff3c4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff3c8;
  float in_stack_fffffffffffff3d0;
  undefined4 uStack_c2c;
  RayDifferential *in_stack_fffffffffffff480;
  ShapeIntersection *in_stack_fffffffffffff488;
  CameraTransform *in_stack_fffffffffffff490;
  undefined7 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49f;
  undefined8 in_stack_fffffffffffff658;
  RayDifferential *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  RayDifferential *in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff678 [16];
  RayDifferential *in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff6d0;
  float local_7b4;
  float local_7b0;
  float local_7ac;
  undefined8 local_7a8;
  undefined8 local_7a0;
  Tuple3<pbrt::Vector3,_float> local_738;
  Tuple3<pbrt::Vector3,_float> local_728;
  Tuple3<pbrt::Vector3,_float> local_718;
  Tuple3<pbrt::Vector3,_float> local_708;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  Tuple3<pbrt::Vector3,_float> local_6d8;
  undefined8 local_6c8;
  Tuple3<pbrt::Vector3,_float> local_6c0;
  undefined1 local_6b0 [64];
  float local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 in_stack_fffffffffffff9b8;
  Vector3f *in_stack_fffffffffffff9c0;
  BSDF *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  undefined1 local_61c [68];
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  float local_590;
  BSDFSample local_588;
  Float local_55c;
  int local_558;
  undefined4 local_544;
  undefined1 local_540 [16];
  float local_530;
  ShapeIntersection *local_4f0;
  undefined8 local_4e4;
  undefined8 local_4dc;
  undefined8 local_4d4;
  undefined8 local_4cc;
  undefined8 local_4c4;
  undefined8 local_4bc;
  undefined8 local_4b4;
  undefined8 local_4ac;
  Float local_4a4;
  undefined8 local_4a0;
  undefined4 local_498;
  undefined8 local_490;
  undefined4 local_488;
  undefined1 local_480 [32];
  Integrator *pIStack_460;
  SampledWavelengths *pSStack_458;
  LightSampleContext local_444;
  float local_414;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  int local_3a8;
  undefined8 local_3a4;
  undefined8 local_39c;
  undefined8 local_394;
  undefined8 local_38c;
  undefined8 local_384;
  undefined8 local_37c;
  undefined8 local_374;
  undefined8 local_36c;
  Float local_364;
  undefined8 local_360;
  undefined4 local_358;
  undefined8 local_350;
  undefined4 local_348;
  undefined1 local_340 [32];
  Integrator *pIStack_320;
  SampledWavelengths *pSStack_318;
  LightSampleContext local_304;
  float local_2d4;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  reference local_290;
  LightHandle *local_288;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_280;
  long local_278;
  optional local_260 [264];
  SurfaceInteraction local_158;
  Float local_60;
  float local_5c;
  int local_58;
  byte local_52;
  byte local_51;
  void *local_40;
  CameraTransform *local_28;
  array<float,_4> local_10;
  undefined1 auVar69 [56];
  
  local_40 = in_R9;
  local_28 = in_RDX;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8.high);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8.high);
  local_51 = 0;
  local_52 = 0;
  local_58 = 0;
  local_5c = 1.0;
  SurfaceInteraction::SurfaceInteraction((SurfaceInteraction *)in_stack_fffffffffffff2d0);
  SVar74.values.values[2] = (float)(int)in_stack_fffffffffffff658;
  SVar74.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffff658 >> 0x20);
  SVar74.values.values[0] = (float)(int)in_stack_fffffffffffff668;
  SVar74.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffff668 >> 0x20);
  do {
    auVar62 = ZEXT464(0x7f800000);
    Integrator::Intersect
              (in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8.high);
    bVar53 = pstd::optional::operator_cast_to_bool(local_260);
    auVar71 = auVar62._8_56_;
    if (bVar53) {
      pSVar54 = pstd::optional<pbrt::ShapeIntersection>::operator->
                          ((optional<pbrt::ShapeIntersection> *)0x79c464);
      VVar72 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff2d0);
      fVar70 = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar62._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar62._8_56_ = auVar71;
      auVar61 = auVar62._0_16_;
      sampler_00 = (SamplerHandle *)0x0;
      pRVar66 = auVar71._0_8_;
      local_3d8 = vmovlpd_avx(auVar61);
      local_3d0 = fVar70;
      local_3c8 = local_3d8;
      local_3c0 = fVar70;
      SVar73 = SurfaceInteraction::Le
                         (in_stack_fffffffffffff300,in_stack_fffffffffffff2f8,
                          in_stack_fffffffffffff2f0);
      auVar37._8_8_ = pRVar66;
      auVar37._0_8_ = SVar73.values.values._8_8_;
      auVar38._8_8_ = sampler_00;
      auVar38._0_8_ = SVar73.values.values._0_8_;
      in_ZMM1 = ZEXT1664(auVar38);
      local_3b8 = vmovlpd_avx(auVar38);
      local_3b0 = vmovlpd_avx(auVar37);
      bVar53 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff2d8);
      auVar71 = in_ZMM1._8_56_;
      if (bVar53) {
        if ((local_58 == 0) || ((local_51 & 1) != 0)) {
          SVar74 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar2._8_56_ = auVar71;
          auVar2._0_8_ = SVar74.values.values._8_8_;
          in_stack_fffffffffffff678 = auVar2._0_16_;
          in_stack_fffffffffffff670 = auVar71._0_8_;
          auVar36._8_8_ = pRVar66;
          auVar36._0_8_ = SVar74.values.values._0_8_;
          local_3f8 = vmovlpd_avx(auVar36);
          local_3f0 = vmovlpd_avx(in_stack_fffffffffffff678);
          pRVar67 = pRVar66;
          in_stack_fffffffffffff690 = pRVar66;
          SVar74 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
          auVar34._8_8_ = pRVar67;
          auVar34._0_8_ = SVar74.values.values._8_8_;
          auVar35._8_8_ = in_stack_fffffffffffff670;
          auVar35._0_8_ = SVar74.values.values._0_8_;
          local_408 = vmovlpd_avx(auVar35);
          local_400 = vmovlpd_avx(auVar34);
          pRVar66 = in_stack_fffffffffffff670;
          in_stack_fffffffffffff660 = pRVar67;
          SVar73 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                           (SampledSpectrum *)in_stack_fffffffffffff2d8);
          auVar32._8_8_ = pRVar66;
          auVar32._0_8_ = SVar73.values.values._8_8_;
          auVar33._8_8_ = pRVar67;
          auVar33._0_8_ = SVar73.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar33);
          local_3e8 = vmovlpd_avx(auVar33);
          local_3e0 = vmovlpd_avx(auVar32);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
        }
        else {
          pstd::optional<pbrt::ShapeIntersection>::operator->
                    ((optional<pbrt::ShapeIntersection> *)0x79c680);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff2d0,
                     (LightHandle *)in_stack_fffffffffffff2c8);
          LightSampleContext::LightSampleContext(&local_444,&local_158);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff2d0,
                     (LightHandle *)in_stack_fffffffffffff2c8);
          FVar59 = LightSamplerHandle::PDF
                             ((LightSamplerHandle *)in_stack_fffffffffffff2f0,
                              (LightSampleContext *)in_stack_fffffffffffff2e8,
                              (LightHandle *)in_stack_fffffffffffff2e0);
          LightSampleContext::LightSampleContext((LightSampleContext *)local_480,&local_158);
          local_498 = *(undefined4 *)(in_RSI + 0x14);
          local_4a0 = *(undefined8 *)(in_RSI + 0xc);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
               (float)in_stack_fffffffffffff348;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
               (float)(int)in_stack_fffffffffffff340;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)in_stack_fffffffffffff340 >> 0x20);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
               (float)in_stack_fffffffffffff34c;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
               (float)in_stack_fffffffffffff350;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = in_stack_fffffffffffff354;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = in_stack_fffffffffffff358;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x._1_1_ = in_stack_fffffffffffff359;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x._2_1_ = in_stack_fffffffffffff35a;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x._3_1_ = in_stack_fffffffffffff35b;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y = in_stack_fffffffffffff35c;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff360;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff364;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff368;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff368 >> 0x20);
          wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffff330;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff330 >> 0x20);
          wi_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff32c;
          in_stack_fffffffffffff2c8 = (Interval<float>)local_480._0_8_;
          in_stack_fffffffffffff2d0 = (Interval<float>)local_480._8_8_;
          in_stack_fffffffffffff2d8 = (Interval<float>)local_480._16_8_;
          in_stack_fffffffffffff2e0 = (Ray *)local_480._24_8_;
          in_stack_fffffffffffff2e8 = pIStack_460;
          in_stack_fffffffffffff2f0 = pSStack_458;
          local_490 = local_4a0;
          local_488 = local_498;
          FVar60 = LightHandle::PDF_Li((LightHandle *)
                                       CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310)
                                       ,ctx_00,wi_00,
                                       (LightSamplingMode)((ulong)in_stack_fffffffffffff308 >> 0x20)
                                      );
          local_414 = FVar59 * FVar60;
          uVar64 = 0;
          local_4a4 = PowerHeuristic(1,local_60,1,local_414);
          pRVar66 = (RayDifferential *)0x0;
          SVar73 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d0,
                              in_stack_fffffffffffff2c8.high);
          auVar30._8_8_ = uVar64;
          auVar30._0_8_ = SVar73.values.values._8_8_;
          auVar31._8_8_ = pRVar66;
          auVar31._0_8_ = SVar73.values.values._0_8_;
          local_4d4 = vmovlpd_avx(auVar31);
          local_4cc = vmovlpd_avx(auVar30);
          SVar73 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar28._8_8_ = pRVar66;
          auVar28._0_8_ = SVar73.values.values._8_8_;
          auVar29._8_8_ = uVar64;
          auVar29._0_8_ = SVar73.values.values._0_8_;
          local_4c4 = vmovlpd_avx(auVar29);
          local_4bc = vmovlpd_avx(auVar28);
          SVar73 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
          auVar26._8_8_ = uVar64;
          auVar26._0_8_ = SVar73.values.values._8_8_;
          auVar27._8_8_ = pRVar66;
          auVar27._0_8_ = SVar73.values.values._0_8_;
          local_4e4 = vmovlpd_avx(auVar27);
          local_4dc = vmovlpd_avx(auVar26);
          SVar73 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                           (SampledSpectrum *)in_stack_fffffffffffff2d8);
          auVar24._8_8_ = pRVar66;
          auVar24._0_8_ = SVar73.values.values._8_8_;
          auVar25._8_8_ = uVar64;
          auVar25._0_8_ = SVar73.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar25);
          local_4b4 = vmovlpd_avx(auVar25);
          local_4ac = vmovlpd_avx(auVar24);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
        }
      }
      local_4f0 = pstd::optional<pbrt::ShapeIntersection>::operator->
                            ((optional<pbrt::ShapeIntersection> *)0x79c961);
      CameraHandle::CameraHandle
                ((CameraHandle *)in_stack_fffffffffffff2d0,(CameraHandle *)in_stack_fffffffffffff2c8
                );
      SamplerHandle::SamplerHandle
                ((SamplerHandle *)in_stack_fffffffffffff2d0,
                 (SamplerHandle *)in_stack_fffffffffffff2c8);
      in_stack_fffffffffffff2c8 = (Interval<float>)local_540;
      SurfaceInteraction::GetBSDF
                (in_stack_fffffffffffff678._0_8_,in_stack_fffffffffffff670,
                 SVar74.values.values._0_8_,(CameraHandle *)in_stack_fffffffffffff660,
                 SVar74.values.values._8_8_,(SamplerHandle *)in_stack_fffffffffffff690);
      bVar53 = BSDF::operator_cast_to_bool((BSDF *)0x79ca2f);
      if (bVar53) {
        if ((local_58 == 0) && (local_40 != (void *)0x0)) {
          local_544 = 0x10;
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8.high);
          for (local_558 = 0; auVar71 = in_ZMM1._8_56_, local_558 < 0x10; local_558 = local_558 + 1)
          {
            local_55c = RadicalInverse((int)((ulong)in_stack_fffffffffffff300 >> 0x20),
                                       (uint64_t)in_stack_fffffffffffff2f8);
            RadicalInverse((int)((ulong)in_stack_fffffffffffff300 >> 0x20),
                           (uint64_t)in_stack_fffffffffffff2f8);
            RadicalInverse((int)((ulong)in_stack_fffffffffffff300 >> 0x20),
                           (uint64_t)in_stack_fffffffffffff2f8);
            Point2<float>::Point2
                      ((Point2<float> *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8.high,
                       in_stack_fffffffffffff2c8.low);
            pSVar55 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                ((optional<pbrt::ShapeIntersection> *)0x79cb97);
            local_5a0 = (pSVar55->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
            local_5a8._0_4_ =
                 (pSVar55->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
            local_5a8._4_4_ =
                 (pSVar55->intr).super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
            in_ZMM1 = ZEXT464(0);
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff3d0;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff3c8.x;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff3c8.y;
            local_598 = local_5a8;
            local_590 = local_5a0;
            BSDF::Sample_f(in_stack_fffffffffffff3b0,woRender,in_stack_fffffffffffff3ac,
                           in_stack_fffffffffffff3a0,(TransportMode)in_stack_fffffffffffff39c,
                           (BxDFReflTransFlags)in_stack_fffffffffffff398);
            bVar53 = BSDFSample::operator_cast_to_bool(&local_588);
            if (bVar53) {
              in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
              auVar71 = in_ZMM1._8_56_;
              if (0.0 < local_588.pdf) {
                pstd::optional<pbrt::ShapeIntersection>::operator->
                          ((optional<pbrt::ShapeIntersection> *)0x79cc89);
                AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff2d0,
                              (Normal3<float> *)in_stack_fffffffffffff2c8);
                uVar64 = 0;
                SVar73 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)in_stack_fffffffffffff2d0,
                                    in_stack_fffffffffffff2c8.high);
                auVar3._8_56_ = auVar71;
                auVar3._0_8_ = SVar73.values.values._8_8_;
                auVar23._8_8_ = uVar64;
                auVar23._0_8_ = SVar73.values.values._0_8_;
                local_5c8 = vmovlpd_avx(auVar23);
                local_5c0 = vmovlpd_avx(auVar3._0_16_);
                uVar65 = 0;
                SVar73 = SampledSpectrum::operator/
                                   ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                                    in_stack_fffffffffffff2d0.high);
                auVar21._8_8_ = uVar64;
                auVar21._0_8_ = SVar73.values.values._8_8_;
                auVar22._8_8_ = uVar65;
                auVar22._0_8_ = SVar73.values.values._0_8_;
                in_ZMM1 = ZEXT1664(auVar22);
                local_5b8 = vmovlpd_avx(auVar22);
                local_5b0 = vmovlpd_avx(auVar21);
                SampledSpectrum::operator+=
                          ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                           (SampledSpectrum *)in_stack_fffffffffffff2d8);
              }
            }
          }
          uVar64 = 0;
          SVar73 = SampledSpectrum::operator/
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              in_stack_fffffffffffff2d0.high);
          auVar4._8_56_ = auVar71;
          auVar4._0_8_ = SVar73.values.values._8_8_;
          pRVar66 = auVar71._0_8_;
          auVar20._8_8_ = uVar64;
          auVar20._0_8_ = SVar73.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar20);
          local_5d8 = vmovlpd_avx(auVar20);
          local_5d0 = vmovlpd_avx(auVar4._0_16_);
          pSVar55 = pstd::optional<pbrt::ShapeIntersection>::operator->
                              ((optional<pbrt::ShapeIntersection> *)0x79cdde);
          CameraHandle::GetCameraTransform((CameraHandle *)in_stack_fffffffffffff2d0);
          VisibleSurface::VisibleSurface
                    ((VisibleSurface *)pSVar55,
                     (SurfaceInteraction *)
                     CONCAT17(in_stack_fffffffffffff49f,in_stack_fffffffffffff498),
                     in_stack_fffffffffffff490,(SampledSpectrum *)in_stack_fffffffffffff488,
                     (SampledWavelengths *)in_stack_fffffffffffff480);
          memcpy(local_40,local_61c,0x44);
        }
        auVar71 = in_ZMM1._12_56_;
        iVar58 = local_58 + 1;
        if (local_58 == *(int *)(in_RDI + 0x68)) {
          local_3a8 = 3;
          local_58 = iVar58;
        }
        else {
          local_58 = iVar58;
          if (((*(byte *)(in_RDI + 0x78) & 1) != 0) && ((local_52 & 1) != 0)) {
            in_FS_OFFSET[-0x59] = in_FS_OFFSET[-0x59] + 1;
            BSDF::Regularize((BSDF *)0x79cec6);
          }
          in_FS_OFFSET[-0x58] = in_FS_OFFSET[-0x58] + 1;
          in_stack_fffffffffffff49f = BSDF::IsNonSpecular((BSDF *)in_stack_fffffffffffff2d0);
          if ((bool)in_stack_fffffffffffff49f) {
            in_FS_OFFSET[-0x57] = in_FS_OFFSET[-0x57] + 1;
            in_stack_fffffffffffff488 = local_4f0;
            in_stack_fffffffffffff490 = local_28;
            SamplerHandle::SamplerHandle
                      ((SamplerHandle *)in_stack_fffffffffffff2d0,
                       (SamplerHandle *)in_stack_fffffffffffff2c8);
            SVar73 = SampleLd(auVar61._8_8_,auVar61._0_8_,
                              (BSDF *)CONCAT44(fVar70,in_stack_fffffffffffff6d0),
                              (SampledWavelengths *)pSVar54,sampler_00);
            auVar5._8_56_ = auVar71;
            auVar5._0_8_ = SVar73.values.values._8_8_;
            uVar65 = auVar71._0_8_;
            auVar61._8_8_ = pRVar66;
            auVar61._0_8_ = SVar73.values.values._0_8_;
            uVar64 = vmovlpd_avx(auVar61);
            in_stack_fffffffffffff9d4 = (undefined4)uVar64;
            in_stack_fffffffffffff9d8 = (undefined4)((ulong)uVar64 >> 0x20);
            uVar64 = vmovlpd_avx(auVar5._0_16_);
            in_stack_fffffffffffff9dc = (undefined4)uVar64;
            in_stack_fffffffffffff480 = pRVar66;
            bVar53 = SampledSpectrum::operator_cast_to_bool
                               ((SampledSpectrum *)in_stack_fffffffffffff2d8);
            if (!bVar53) {
              *(long *)(*in_FS_OFFSET + -0x2b0) = *(long *)(*in_FS_OFFSET + -0x2b0) + 1;
            }
            SVar73 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                                (SampledSpectrum *)in_stack_fffffffffffff2d0);
            auVar18._8_8_ = pRVar66;
            auVar18._0_8_ = SVar73.values.values._8_8_;
            auVar19._8_8_ = uVar65;
            auVar19._0_8_ = SVar73.values.values._0_8_;
            local_658 = vmovlpd_avx(auVar19);
            local_650 = vmovlpd_avx(auVar18);
            SVar73 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
            auVar16._8_8_ = uVar65;
            auVar16._0_8_ = SVar73.values.values._8_8_;
            auVar17._8_8_ = pRVar66;
            auVar17._0_8_ = SVar73.values.values._0_8_;
            local_668 = vmovlpd_avx(auVar17);
            local_660 = vmovlpd_avx(auVar16);
            SVar73 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                             (SampledSpectrum *)in_stack_fffffffffffff2d8);
            auVar14._8_8_ = pRVar66;
            auVar14._0_8_ = SVar73.values.values._8_8_;
            auVar15._8_8_ = uVar65;
            auVar15._0_8_ = SVar73.values.values._0_8_;
            in_stack_fffffffffffff9b8 = vmovlpd_avx(auVar15);
            in_stack_fffffffffffff9c0 = (Vector3f *)vmovlpd_avx(auVar14);
            SampledSpectrum::operator+=
                      ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                       (SampledSpectrum *)in_stack_fffffffffffff2d8);
          }
          VVar72 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff2d0);
          local_6b0._48_4_ = VVar72.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar13._8_8_ = pRVar66;
          auVar13._0_8_ = VVar72.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          local_6b0._40_8_ = vmovlpd_avx(auVar13);
          local_6b0._56_8_ = local_6b0._40_8_;
          local_670 = (float)local_6b0._48_4_;
          in_stack_fffffffffffff3c4 =
               SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff2d0);
          local_6c0.z = local_670;
          local_6c0.x = (float)local_6b0._56_4_;
          local_6c0.y = (float)local_6b0._60_4_;
          local_6b0._36_4_ = in_stack_fffffffffffff3c4;
          in_stack_fffffffffffff3c8 =
               (Tuple2<pbrt::Point2,_float>)
               SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff2c8);
          in_stack_fffffffffffff3d0 = (float)extraout_XMM0_Qb;
          uStack_c2c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
          auVar12._8_4_ = in_stack_fffffffffffff3d0;
          auVar12._0_4_ = in_stack_fffffffffffff3c8.x;
          auVar12._4_4_ = in_stack_fffffffffffff3c8.y;
          auVar12._12_4_ = uStack_c2c;
          local_6c8 = vmovlpd_avx(auVar12);
          local_6d8.z = local_6c0.z;
          local_6d8.x = local_6c0.x;
          local_6d8.y = local_6c0.y;
          in_ZMM1 = ZEXT464(0);
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff3d0;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff3c8.x;
          woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff3c8.y;
          BSDF::Sample_f(in_stack_fffffffffffff3b0,woRender_00,in_stack_fffffffffffff3ac,
                         in_stack_fffffffffffff3a0,(TransportMode)in_stack_fffffffffffff39c,
                         (BxDFReflTransFlags)in_stack_fffffffffffff398);
          bVar53 = BSDFSample::operator_cast_to_bool((BSDFSample *)local_6b0);
          auVar71 = in_ZMM1._8_56_;
          in_stack_fffffffffffff3c0 = CONCAT13(bVar53,(int3)in_stack_fffffffffffff3c0);
          if (bVar53) {
            in_stack_fffffffffffff3b0 = (BSDF *)local_6b0;
            in_stack_fffffffffffff3bc =
                 AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff2d0,
                               (Normal3<float> *)in_stack_fffffffffffff2c8);
            pPVar68 = (Point2f *)0x0;
            SVar73 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff2d0,
                                in_stack_fffffffffffff2c8.high);
            auVar6._8_56_ = auVar71;
            auVar6._0_8_ = SVar73.values.values._8_8_;
            woRender_01 = auVar6._0_12_;
            in_stack_fffffffffffff398 = SVar73.values.values[0];
            in_stack_fffffffffffff39c = SVar73.values.values[1];
            auVar11._8_8_ = pPVar68;
            auVar11._0_8_ = SVar73.values.values._0_8_;
            local_6f8 = vmovlpd_avx(auVar11);
            local_6f0 = vmovlpd_avx(auVar6._0_16_);
            in_stack_fffffffffffff330 = 0;
            in_stack_fffffffffffff3a0 = pPVar68;
            SVar73 = SampledSpectrum::operator/
                               ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                                in_stack_fffffffffffff2d0.high);
            in_stack_fffffffffffff368 = SVar73.values.values._8_8_;
            fVar70 = SUB84(pPVar68,0);
            uStack_c8c = (undefined4)((ulong)pPVar68 >> 0x20);
            auVar9._8_4_ = fVar70;
            auVar9._0_8_ = in_stack_fffffffffffff368;
            auVar9._12_4_ = uStack_c8c;
            auVar10._8_8_ = in_stack_fffffffffffff330;
            auVar10._0_8_ = SVar73.values.values._0_8_;
            local_6e8 = vmovlpd_avx(auVar10);
            local_6e0 = vmovlpd_avx(auVar9);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                       (SampledSpectrum *)in_stack_fffffffffffff2d8);
            bVar53 = BSDF::SampledPDFIsProportional((BSDF *)0x79d35d);
            in_stack_fffffffffffff364 = CONCAT13(bVar53,(int3)in_stack_fffffffffffff364);
            in_stack_fffffffffffff35c = (Float)local_6b0._28_4_;
            if (bVar53) {
              local_708.z = local_670;
              local_708.x = (float)local_6b0._56_4_;
              local_708.y = (float)local_6b0._60_4_;
              local_718.z = (float)local_6b0._24_4_;
              local_718.x = (float)local_6b0._16_4_;
              local_718.y = (float)local_6b0._20_4_;
              local_728.z = local_670;
              local_728.x = (float)local_6b0._56_4_;
              local_728.y = (float)local_6b0._60_4_;
              in_stack_fffffffffffff330 = 0;
              local_738.z = (float)local_6b0._24_4_;
              local_738.x = (float)local_6b0._16_4_;
              local_738.y = (float)local_6b0._20_4_;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar70;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff368;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)(int)((ulong)in_stack_fffffffffffff368 >> 0x20);
              in_stack_fffffffffffff360 =
                   BSDF::PDF((BSDF *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                             (Vector3f)woRender_01,wiRender,in_stack_fffffffffffff34c,
                             in_stack_fffffffffffff348);
              in_stack_fffffffffffff35c = in_stack_fffffffffffff360;
            }
            local_60 = in_stack_fffffffffffff35c;
            in_stack_fffffffffffff35b = BSDFSample::IsSpecular((BSDFSample *)0x79d476);
            local_51 = in_stack_fffffffffffff35b;
            in_stack_fffffffffffff35a = BSDFSample::IsSpecular((BSDFSample *)0x79d49c);
            local_52 = (local_52 | ~in_stack_fffffffffffff35a) & 1;
            in_stack_fffffffffffff359 = BSDFSample::IsTransmission((BSDFSample *)0x79d4cd);
            if ((bool)in_stack_fffffffffffff359) {
              in_stack_fffffffffffff354 = Sqr<float>(local_530);
              local_5c = in_stack_fffffffffffff354 * local_5c;
            }
            pSVar54 = pstd::optional<pbrt::ShapeIntersection>::operator->
                                ((optional<pbrt::ShapeIntersection> *)0x79d524);
            in_stack_fffffffffffff348 = (BxDFReflTransFlags)pSVar54;
            in_stack_fffffffffffff34c = (TransportMode)((ulong)pSVar54 >> 0x20);
            SurfaceInteraction::operator=
                      ((SurfaceInteraction *)in_stack_fffffffffffff2d0,
                       (SurfaceInteraction *)in_stack_fffffffffffff2c8);
            SurfaceInteraction::SpawnRay
                      ((SurfaceInteraction *)
                       CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                       (RayDifferential *)
                       CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                       (BxDFFlags)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
            RayDifferential::operator=
                      ((RayDifferential *)in_stack_fffffffffffff2d0,
                       (RayDifferential *)in_stack_fffffffffffff2c8);
            in_stack_fffffffffffff340 = 0;
            SVar73 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff2d0,
                                in_stack_fffffffffffff2c8.high);
            in_stack_fffffffffffff32c = SVar73.values.values[3];
            auVar7._8_8_ = in_stack_fffffffffffff330;
            auVar7._0_8_ = SVar73.values.values._8_8_;
            auVar8._8_8_ = in_stack_fffffffffffff340;
            auVar8._0_8_ = SVar73.values.values._0_8_;
            local_7a8 = vmovlpd_avx(auVar8);
            local_7a0 = vmovlpd_avx(auVar7);
            FVar59 = SampledSpectrum::MaxComponentValue
                               ((SampledSpectrum *)in_stack_fffffffffffff2d0);
            in_ZMM1 = ZEXT464((uint)FVar59);
            if ((FVar59 < *(float *)(in_RDI + 0x6c)) && (1 < local_58)) {
              local_7b0 = 0.0;
              FVar59 = SampledSpectrum::MaxComponentValue
                                 ((SampledSpectrum *)in_stack_fffffffffffff2d0);
              local_7b4 = 1.0 - FVar59;
              pfVar56 = std::max<float>(&local_7b0,&local_7b4);
              local_7ac = *pfVar56;
              in_stack_fffffffffffff314 =
                   SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff2d0);
              in_ZMM1 = ZEXT464((uint)in_stack_fffffffffffff314);
              if (in_stack_fffffffffffff314 < local_7ac) {
                local_3a8 = 3;
                goto LAB_0079d6e6;
              }
              in_ZMM1 = ZEXT464(0);
              SampledSpectrum::operator/=
                        ((SampledSpectrum *)in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8.high
                        );
            }
            local_3a8 = 0;
          }
          else {
            local_3a8 = 3;
          }
        }
      }
      else {
        pstd::optional<pbrt::ShapeIntersection>::operator->
                  ((optional<pbrt::ShapeIntersection> *)0x79ca62);
        SurfaceInteraction::SkipIntersection
                  ((SurfaceInteraction *)
                   CONCAT44(in_stack_fffffffffffff3c4,in_stack_fffffffffffff3c0),
                   (RayDifferential *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8),
                   (Float)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
        local_3a8 = 2;
      }
    }
    else {
      local_278 = in_RDI + 0x28;
      local_280._M_current =
           (LightHandle *)
           std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                     ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                      in_stack_fffffffffffff2c8);
      local_288 = (LightHandle *)
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             in_stack_fffffffffffff2c8);
      while( true ) {
        auVar69 = auVar62._8_56_;
        bVar53 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                             *)in_stack_fffffffffffff2d0,
                            (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                             *)in_stack_fffffffffffff2c8);
        auVar71 = in_ZMM1._8_56_;
        if (!bVar53) break;
        local_290 = __gnu_cxx::
                    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                    ::operator*(&local_280);
        SVar73 = LightHandle::Le((LightHandle *)in_stack_fffffffffffff2f0,
                                 (Ray *)in_stack_fffffffffffff2e8,
                                 (SampledWavelengths *)in_stack_fffffffffffff2e0);
        auVar1._8_56_ = auVar71;
        auVar1._0_8_ = SVar73.values.values._8_8_;
        auVar63._0_8_ = SVar73.values.values._0_8_;
        auVar63._8_56_ = auVar69;
        uVar64 = auVar71._0_8_;
        uVar65 = auVar69._0_8_;
        local_2a0 = vmovlpd_avx(auVar63._0_16_);
        local_298 = vmovlpd_avx(auVar1._0_16_);
        if ((local_58 == 0) || ((local_51 & 1) != 0)) {
          SVar73 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar51._8_8_ = uVar65;
          auVar51._0_8_ = SVar73.values.values._8_8_;
          auVar52._8_8_ = uVar64;
          auVar52._0_8_ = SVar73.values.values._0_8_;
          local_2c0 = vmovlpd_avx(auVar52);
          local_2b8 = vmovlpd_avx(auVar51);
          SVar73 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
          auVar49._8_8_ = uVar64;
          auVar49._0_8_ = SVar73.values.values._8_8_;
          auVar50._8_8_ = uVar65;
          auVar50._0_8_ = SVar73.values.values._0_8_;
          local_2d0 = vmovlpd_avx(auVar50);
          local_2c8 = vmovlpd_avx(auVar49);
          SVar73 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                           (SampledSpectrum *)in_stack_fffffffffffff2d8);
          auVar47._8_8_ = uVar65;
          auVar47._0_8_ = SVar73.values.values._8_8_;
          auVar62 = ZEXT1664(auVar47);
          auVar48._8_8_ = uVar64;
          auVar48._0_8_ = SVar73.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar48);
          local_2b0 = vmovlpd_avx(auVar48);
          local_2a8 = vmovlpd_avx(auVar47);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
        }
        else {
          LightSampleContext::LightSampleContext(&local_304,&local_158);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff2d0,
                     (LightHandle *)in_stack_fffffffffffff2c8);
          FVar59 = LightSamplerHandle::PDF
                             ((LightSamplerHandle *)in_stack_fffffffffffff2f0,
                              (LightSampleContext *)in_stack_fffffffffffff2e8,
                              (LightHandle *)in_stack_fffffffffffff2e0);
          LightSampleContext::LightSampleContext((LightSampleContext *)local_340,&local_158);
          local_358 = *(undefined4 *)(in_RSI + 0x14);
          local_360 = *(undefined8 *)(in_RSI + 0xc);
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
               (float)in_stack_fffffffffffff348;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
               (float)(int)in_stack_fffffffffffff340;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)in_stack_fffffffffffff340 >> 0x20);
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
               (float)in_stack_fffffffffffff34c;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
               (float)in_stack_fffffffffffff350;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = in_stack_fffffffffffff354;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.x._0_1_ = in_stack_fffffffffffff358;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.x._1_1_ = in_stack_fffffffffffff359;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.x._2_1_ = in_stack_fffffffffffff35a;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.x._3_1_ = in_stack_fffffffffffff35b;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.y = in_stack_fffffffffffff35c;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff360;
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff364;
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff368;
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff368 >> 0x20);
          wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffff330;
          wi.super_Tuple3<pbrt::Vector3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff330 >> 0x20);
          wi.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff32c;
          in_stack_fffffffffffff2c8 = (Interval<float>)local_340._0_8_;
          in_stack_fffffffffffff2d0 = (Interval<float>)local_340._8_8_;
          in_stack_fffffffffffff2d8 = (Interval<float>)local_340._16_8_;
          in_stack_fffffffffffff2e0 = (Ray *)local_340._24_8_;
          in_stack_fffffffffffff2e8 = pIStack_320;
          in_stack_fffffffffffff2f0 = pSStack_318;
          local_350 = local_360;
          local_348 = local_358;
          FVar60 = LightHandle::PDF_Li((LightHandle *)
                                       CONCAT44(in_stack_fffffffffffff314,in_stack_fffffffffffff310)
                                       ,ctx,wi,(LightSamplingMode)
                                               ((ulong)in_stack_fffffffffffff308 >> 0x20));
          local_2d4 = FVar59 * FVar60;
          uVar64 = 0;
          local_364 = PowerHeuristic(1,local_60,1,local_2d4);
          uVar65 = 0;
          SVar73 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d0,
                              in_stack_fffffffffffff2c8.high);
          auVar45._8_8_ = uVar64;
          auVar45._0_8_ = SVar73.values.values._8_8_;
          auVar46._8_8_ = uVar65;
          auVar46._0_8_ = SVar73.values.values._0_8_;
          local_394 = vmovlpd_avx(auVar46);
          local_38c = vmovlpd_avx(auVar45);
          SVar73 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar43._8_8_ = uVar65;
          auVar43._0_8_ = SVar73.values.values._8_8_;
          auVar44._8_8_ = uVar64;
          auVar44._0_8_ = SVar73.values.values._0_8_;
          local_384 = vmovlpd_avx(auVar44);
          local_37c = vmovlpd_avx(auVar43);
          SVar73 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
          auVar41._8_8_ = uVar64;
          auVar41._0_8_ = SVar73.values.values._8_8_;
          auVar42._8_8_ = uVar65;
          auVar42._0_8_ = SVar73.values.values._0_8_;
          local_3a4 = vmovlpd_avx(auVar42);
          local_39c = vmovlpd_avx(auVar41);
          SVar73 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                           (SampledSpectrum *)in_stack_fffffffffffff2d8);
          auVar39._8_8_ = uVar65;
          auVar39._0_8_ = SVar73.values.values._8_8_;
          auVar62 = ZEXT1664(auVar39);
          auVar40._8_8_ = uVar64;
          auVar40._0_8_ = SVar73.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar40);
          local_374 = vmovlpd_avx(auVar40);
          local_36c = vmovlpd_avx(auVar39);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
        }
        __gnu_cxx::
        __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
        ::operator++(&local_280);
      }
      local_3a8 = 3;
    }
LAB_0079d6e6:
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x79d6f3);
    in_stack_fffffffffffff310 = local_3a8;
    if ((local_3a8 != 0) && (local_3a8 != 2)) {
      *(long *)(*in_FS_OFFSET + -0x2a8) = (long)local_58 + *(long *)(*in_FS_OFFSET + -0x2a8);
      *(long *)(*in_FS_OFFSET + -0x2a0) = *(long *)(*in_FS_OFFSET + -0x2a0) + 1;
      if ((long)local_58 < *(long *)(*in_FS_OFFSET + -0x720)) {
        lVar57 = (long)local_58;
      }
      else {
        lVar57 = *(long *)(*in_FS_OFFSET + -0x720);
      }
      *(long *)(*in_FS_OFFSET + -0x720) = lVar57;
      if (*(long *)(*in_FS_OFFSET + -0x718) < (long)local_58) {
        lVar57 = (long)local_58;
      }
      else {
        lVar57 = *(long *)(*in_FS_OFFSET + -0x718);
      }
      *(long *)(*in_FS_OFFSET + -0x718) = lVar57;
      return (array<float,_4>)(array<float,_4>)local_10.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum PathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;
    Float etaScale = 1, bsdfPDF;
    SurfaceInteraction prevIntr;

    while (true) {
        // Find next path vertex and accumulate contribution
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        // Add emitted light at path vertex or from the environment
        if (!si) {
            // Incorporate emission from infinite lights for escaped ray
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (depth == 0 || specularBounce)
                    L += SafeDiv(beta * Le, lambda.PDF());
                else {
                    // Compute MIS weight for infinite light
                    Float lightPDF =
                        lightSampler.PDF(prevIntr, light) *
                        light.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                    Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                    L += SafeDiv(beta * weight * Le, lambda.PDF());
                }
            }

            break;
        }
        // Incorporate emission from emissive surface hit by ray
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, lambda.PDF());
            else {
                // Compute MIS weight for area light
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntr, areaLight) *
                    areaLight.PDF_Li(prevIntr, ray.d, LightSamplingMode::WithMIS);
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);

                L += SafeDiv(beta * weight * Le, lambda.PDF());
            }
        }

        SurfaceInteraction &isect = si->intr;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurface_ at first intersection
        if (depth == 0 && visibleSurface != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                auto bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs && bs.pdf > 0)
                    rho += bs.f * AbsDot(bs.wi, si->intr.shading.n) / bs.pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurface =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Sample direct illumination from the light sources
        if (bsdf.IsNonSpecular()) {
            ++totalPaths;
            SampledSpectrum Ld = SampleLd(isect, bsdf, lambda, sampler);
            if (!Ld)
                ++zeroRadiancePaths;
            L += SafeDiv(beta * Ld, lambda.PDF());
        }

        // Sample BSDF to get new path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update path state variables for after surface scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
        bsdfPDF = bsdf.SampledPDFIsProportional() ? bsdf.PDF(wo, bs.wi) : bs.pdf;
        DCHECK(!IsInf(beta.y(lambda)));
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        prevIntr = si->intr;

        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Possibly terminate the path with Russian roulette
        SampledSpectrum rrBeta = beta * etaScale;
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            beta /= 1 - q;
            DCHECK(!IsInf(beta.y(lambda)));
        }
    }
    ReportValue(pathLength, depth);
    return L;
}